

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O1

bool __thiscall
QGenericItemModel::moveRows
          (QGenericItemModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationRow)

{
  long in_FS_OFFSET;
  bool ret;
  int local_54;
  int local_50;
  int local_4c;
  int *local_48;
  QModelIndex *pQStack_40;
  int *local_38;
  int *piStack_30;
  QModelIndex *local_28;
  undefined1 local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  piStack_30 = &local_4c;
  local_38 = &local_50;
  local_48 = &local_54;
  local_11 = 0;
  local_54 = destinationRow;
  local_50 = count;
  local_4c = sourceRow;
  pQStack_40 = destinationParent;
  local_28 = sourceParent;
  (**(code **)(*(long *)(this + 0x10) + 8))(9,*(long *)(this + 0x10),&local_11);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool QGenericItemModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count,
                                 const QModelIndex &destinationParent, int destinationRow)
{
    return impl->call<bool>(QGenericItemModelImplBase::MoveRows,
                            sourceParent, sourceRow, count,
                            destinationParent, destinationRow);
}